

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O2

void left_amount_widget_set_proc(Am_Object *cmd)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  ostream *poVar5;
  Am_Object win;
  Am_Object AStack_28;
  Am_Object local_20;
  
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&AStack_28);
  Am_Object::~Am_Object(&AStack_28);
  pAVar3 = Am_Object::Get(cmd,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&local_20,0xfa,0);
  pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)&local_20,(ulong)Am_LEFT_HOW);
  pAVar3 = Am_Object::Get(&AStack_28,0x169,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&AStack_28);
  switch(iVar2) {
  case 10:
    *(int *)((long)pvVar4 + 0x10) = iVar1;
    break;
  case 0xb:
    *(int *)((long)pvVar4 + 0x14) = iVar1;
    break;
  case 0xc:
  case 0xd:
  case 0xf:
  case 0x10:
    *(int *)((long)pvVar4 + 0x18) = iVar1;
    break;
  case 0xe:
    *(int *)((long)pvVar4 + 0x1c) = iVar1;
    break;
  default:
    if (1 < iVar2 - 0x65U) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar5 = std::operator<<(poVar5,"Bad type for left control ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      std::endl<char,std::char_traits<char>>(poVar5);
      Am_Error();
    }
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, left_amount_widget_set,
                 (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  int new_val = cmd.Get(Am_VALUE);
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  int left_control = win.Get_Object(Am_LEFT_HOW).Get(Am_VALUE);
  switch (left_control) {
  case am_change_equals:
    loc_values->left_equals = new_val;
    break;
  case am_change_offset:
    loc_values->left_offset = new_val;
    break;
  case am_ask_user_generalize:
    break; //shouldn't happen
  case am_ask_user_type:
    break; //shouldn't happen
  case am_change_offset_centered:
    loc_values->left_centered = new_val;
    break;
  case am_change_offset_left_outside:
  case am_change_offset_left_inside:
  case am_change_offset_right_inside:
  case am_change_offset_right_outside:
    loc_values->left_object_offset = new_val;
    break;
  default:
    Am_ERROR("Bad type for left control " << left_control);
  } //end switch
}